

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_orc_i64_sparc64(TCGContext_conflict8 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGv_i64 ret_00;
  uintptr_t o;
  
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_not_i64_sparc64(tcg_ctx,ret_00,arg2);
  tcg_gen_or_i64_sparc64(tcg_ctx,ret,arg1,ret_00);
  tcg_temp_free_internal_sparc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_orc_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_orc_i32(tcg_ctx, TCGV_LOW(tcg_ctx, ret), TCGV_LOW(tcg_ctx, arg1), TCGV_LOW(tcg_ctx, arg2));
        tcg_gen_orc_i32(tcg_ctx, TCGV_HIGH(tcg_ctx, ret), TCGV_HIGH(tcg_ctx, arg1), TCGV_HIGH(tcg_ctx, arg2));
#elif TCG_TARGET_HAS_orc_i64
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_orc_i64, ret, arg1, arg2);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_not_i64(tcg_ctx, t0, arg2);
        tcg_gen_or_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
#endif
}